

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_free_restoration_buffers(AV1_COMMON *cm)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    av1_free_restoration_struct
              ((RestorationInfo *)((long)&cm->rst_info[0].frame_restoration_type + lVar2));
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0xc0);
  aom_free(cm->rst_tmpbuf);
  lVar2 = 0;
  cm->rst_tmpbuf = (int32_t *)0x0;
  aom_free(cm->rlbs);
  cm->rlbs = (RestorationLineBuffers *)0x0;
  do {
    aom_free(*(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_above + lVar2));
    aom_free(*(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_below + lVar2));
    puVar1 = (undefined8 *)((long)&cm->rst_info[0].boundaries.stripe_boundary_above + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0xc0);
  aom_free_frame_buffer(&cm->rst_frame);
  return;
}

Assistant:

void av1_free_restoration_buffers(AV1_COMMON *cm) {
  int p;
  for (p = 0; p < MAX_MB_PLANE; ++p)
    av1_free_restoration_struct(&cm->rst_info[p]);
  aom_free(cm->rst_tmpbuf);
  cm->rst_tmpbuf = NULL;
  aom_free(cm->rlbs);
  cm->rlbs = NULL;
  for (p = 0; p < MAX_MB_PLANE; ++p) {
    RestorationStripeBoundaries *boundaries = &cm->rst_info[p].boundaries;
    aom_free(boundaries->stripe_boundary_above);
    aom_free(boundaries->stripe_boundary_below);
    boundaries->stripe_boundary_above = NULL;
    boundaries->stripe_boundary_below = NULL;
  }

  aom_free_frame_buffer(&cm->rst_frame);
}